

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzrot::ComputeNF(ChNodeFEAxyzrot *this)

{
  ChVectorDynamic<> *in_RCX;
  double *in_RDX;
  ChVectorDynamic<> *in_RSI;
  ChVectorDynamic<> *in_R8;
  ChVectorDynamic<> *in_R9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  ComputeNF((ChNodeFEAxyzrot *)&this[-1].variables.inv_inertia,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,
            in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  return;
}

Assistant:

void ChNodeFEAxyzrot::ComputeNF(
    const double U,              // x coordinate of application point in absolute space
    const double V,              // y coordinate of application point in absolute space
    const double W,              // z coordinate of application point in absolute space
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is 6, it is {Force,Torque} both in absolute coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    ChVector<> abs_pos(U, V, W);
    ChVector<> absF(F.segment(0, 3));
    ChVector<> absT(F.segment(3, 3));
    ChVector<> body_absF;
    ChVector<> body_locT;
    ChCoordsys<> nodecoord;
    if (state_x)
        nodecoord = state_x->segment(0, 7);  // the numerical jacobian algo might change state_x
    else
        nodecoord = this->coord;

    // compute Q components F,T, given current state of 'nodecoord'. Note T in Q is in local csys, F is an abs csys
    body_absF = absF;
    body_locT = nodecoord.rot.RotateBack(absT + ((abs_pos - nodecoord.pos) % absF));
    Qi.segment(0, 3) = body_absF.eigen();
    Qi.segment(3, 3) = body_locT.eigen();
    detJ = 1;  // not needed because not used in quadrature.
}